

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O1

void get_type_info(void)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  Grand *pGVar4;
  size_t sVar5;
  long *plVar6;
  int i;
  int iVar7;
  char *__s;
  
  iVar7 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n Loop ",7);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
    pGVar4 = get_one();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Now processing type ",0x14);
    __s = *(char **)(pGVar4->_vptr_Grand[-1] + 8) +
          (**(char **)(pGVar4->_vptr_Grand[-1] + 8) == '*');
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    (**pGVar4->_vptr_Grand)(pGVar4);
    plVar6 = (long *)__dynamic_cast(pGVar4,&L15_5::Grand::typeinfo,&L15_5::Superb::typeinfo,0);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    if (*(char **)(pGVar4->_vptr_Grand[-1] + 8) == "N5L15_511MagnificentE") {
LAB_00117de8:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Yes, you area really magnificent.......\n",0x28);
    }
    else {
      iVar1 = strcmp("N5L15_511MagnificentE",*(char **)(pGVar4->_vptr_Grand[-1] + 8));
      if (iVar1 == 0) goto LAB_00117de8;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void get_type_info() {
    using namespace L15_5;
    using std::cout;
    using std::endl;

    srand(time(0));
    Grand * pg;
    Superb * ps;
    for (int i = 0; i < 5; i++) {
        cout << "\n Loop " << i << ":\n";
        pg = get_one();
        cout << "Now processing type " << typeid(*pg).name() << "\n";
        pg ->speak();
        if (ps = dynamic_cast<Superb *>(pg)) {
            ps->say();
        }
        //  similar to 'pg instanceof Magnificent'
        if (typeid(Magnificent) == typeid(*pg)) {
            cout << "Yes, you area really magnificent.......\n";
        }
    }
}